

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

GetTraceStatsCallbackArgs * __thiscall
perfetto::TracingSession::GetTraceStatsBlocking
          (GetTraceStatsCallbackArgs *__return_storage_ptr__,TracingSession *this)

{
  undefined1 local_d8 [8];
  unique_lock<std::mutex> lock;
  anon_class_32_4_0547eb2a local_b8;
  function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)> local_98;
  bool local_72 [2];
  condition_variable local_70 [6];
  bool stats_read;
  condition_variable cv;
  undefined1 local_40 [8];
  mutex mutex;
  TracingSession *this_local;
  GetTraceStatsCallbackArgs *result;
  
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)this;
  std::mutex::mutex((mutex *)local_40);
  ::std::condition_variable::condition_variable(local_70);
  local_72[1] = false;
  GetTraceStatsCallbackArgs::GetTraceStatsCallbackArgs(__return_storage_ptr__);
  local_72[0] = false;
  local_b8.stats_read = local_72;
  local_b8.mutex = (mutex *)local_40;
  local_b8.result = __return_storage_ptr__;
  local_b8.cv = local_70;
  ::std::function<void(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::
  function<perfetto::TracingSession::GetTraceStatsBlocking()::__0,void>
            ((function<void(perfetto::TracingSession::GetTraceStatsCallbackArgs)> *)&local_98,
             &local_b8);
  (*this->_vptr_TracingSession[0xd])(this,&local_98);
  std::function<void_(perfetto::TracingSession::GetTraceStatsCallbackArgs)>::~function(&local_98);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_d8,(mutex_type *)local_40);
  ::std::condition_variable::wait<perfetto::TracingSession::GetTraceStatsBlocking()::__1>
            (local_70,(unique_lock<std::mutex> *)local_d8,(anon_class_8_1_a7caa2f4)local_72);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_d8);
  local_72[1] = true;
  ::std::condition_variable::~condition_variable(local_70);
  return __return_storage_ptr__;
}

Assistant:

TracingSession::GetTraceStatsCallbackArgs
TracingSession::GetTraceStatsBlocking() {
  std::mutex mutex;
  std::condition_variable cv;
  GetTraceStatsCallbackArgs result;
  bool stats_read = false;

  GetTraceStats(
      [&mutex, &result, &stats_read, &cv](GetTraceStatsCallbackArgs args) {
        result = std::move(args);
        std::unique_lock<std::mutex> lock(mutex);
        stats_read = true;
        cv.notify_one();
      });

  {
    std::unique_lock<std::mutex> lock(mutex);
    cv.wait(lock, [&stats_read] { return stats_read; });
  }
  return result;
}